

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::JavascriptArray::HasPropertyQuery
          (JavascriptArray *this,PropertyId propertyId,PropertyValueInfo *info)

{
  BOOL BVar1;
  uint32 local_34;
  ScriptContext *pSStack_30;
  uint32 index;
  ScriptContext *scriptContext;
  PropertyValueInfo *info_local;
  JavascriptArray *pJStack_18;
  PropertyId propertyId_local;
  JavascriptArray *this_local;
  
  if (propertyId == 0xd1) {
    this_local._4_4_ = Property_Found;
  }
  else {
    scriptContext = (ScriptContext *)info;
    info_local._4_4_ = propertyId;
    pJStack_18 = this;
    pSStack_30 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    BVar1 = ScriptContext::IsNumericPropertyId(pSStack_30,info_local._4_4_,&local_34);
    if (BVar1 == 0) {
      this_local._4_4_ =
           DynamicObject::HasPropertyQuery
                     ((DynamicObject *)this,info_local._4_4_,(PropertyValueInfo *)scriptContext);
    }
    else {
      BVar1 = RecyclableObject::HasItem((RecyclableObject *)this,local_34);
      this_local._4_4_ = JavascriptConversion::BooleanToPropertyQueryFlags(BVar1);
    }
  }
  return this_local._4_4_;
}

Assistant:

PropertyQueryFlags JavascriptArray::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        if (propertyId == PropertyIds::length)
        {
            return PropertyQueryFlags::Property_Found;
        }

        ScriptContext* scriptContext = GetScriptContext();
        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            return JavascriptConversion::BooleanToPropertyQueryFlags(this->HasItem(index));
        }

        return DynamicObject::HasPropertyQuery(propertyId, info);
    }